

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

upb_MapInsertStatus
upb_Map_Insert(upb_Map *map,upb_MessageValue key,upb_MessageValue val,upb_Arena *arena)

{
  upb_MapInsertStatus uVar1;
  upb_Arena *arena_local;
  upb_Map *map_local;
  upb_MessageValue val_local;
  upb_MessageValue key_local;
  
  val_local.int64_val = val.str_val.size;
  map_local = val.map_val;
  key_local.int64_val = key.str_val.size;
  val_local.str_val.size = key._0_8_;
  if (arena != (upb_Arena *)0x0) {
    uVar1 = _upb_Map_Insert(map,&val_local.str_val.size,(long)map->key_size,&map_local,
                            (long)map->val_size,arena);
    return uVar1;
  }
  __assert_fail("arena",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                ,0x46,
                "upb_MapInsertStatus upb_Map_Insert(upb_Map *, upb_MessageValue, upb_MessageValue, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE upb_MapInsertStatus _upb_Map_Insert(struct upb_Map* map,
                                               const void* key, size_t key_size,
                                               void* val, size_t val_size,
                                               upb_Arena* a) {
  UPB_ASSERT(!upb_Map_IsFrozen(map));

  // Prep the value.
  upb_value tabval = {0};
  if (!_upb_map_tovalue(val, val_size, &tabval, a)) {
    return kUpb_MapInsertStatus_OutOfMemory;
  }

  bool removed;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView strkey = _upb_map_tokey(key, key_size);
    // TODO: add overwrite operation to minimize number of lookups.
    removed =
        upb_strtable_remove2(&map->t.strtable, strkey.data, strkey.size, NULL);
    if (!upb_strtable_insert(&map->t.strtable, strkey.data, strkey.size, tabval,
                             a)) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
  } else {
    uintptr_t intkey = _upb_map_tointkey(key, key_size);
    removed = upb_inttable_remove(&map->t.inttable, intkey, NULL);
    if (!upb_inttable_insert(&map->t.inttable, intkey, tabval, a)) {
      return kUpb_MapInsertStatus_OutOfMemory;
    }
  }
  return removed ? kUpb_MapInsertStatus_Replaced
                 : kUpb_MapInsertStatus_Inserted;
}